

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O3

bool __thiscall
re2::Prog::UnsafeSearchBacktrack
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  int nsubmatch;
  bool bVar1;
  int iVar2;
  StringPiece *submatch;
  StringPiece *pSVar3;
  Backtracker b;
  StringPiece local_290;
  Backtracker local_280;
  
  local_290.ptr_ = (char *)0x0;
  local_290.length_ = 0;
  iVar2 = 1;
  if (1 < nmatch) {
    iVar2 = nmatch;
  }
  pSVar3 = match;
  if (nmatch < 1) {
    pSVar3 = &local_290;
  }
  submatch = match;
  nsubmatch = nmatch;
  if (kind == kFullMatch) {
    submatch = pSVar3;
    nsubmatch = iVar2;
  }
  local_280.text_.ptr_ = (char *)0x0;
  local_280.text_.length_ = 0;
  local_280.context_.ptr_ = (char *)0x0;
  local_280.context_.length_ = 0;
  local_280.anchored_ = false;
  local_280.longest_ = false;
  local_280.endmatch_ = false;
  local_280.submatch_ = (StringPiece *)0x0;
  local_280.nsubmatch_ = 0;
  local_280.visited_ = (uint32 *)0x0;
  local_280.nvisited_ = 0;
  local_280.prog_ = this;
  bVar1 = Backtracker::Search(&local_280,text,context,anchor == kAnchored || kind == kFullMatch,
                              kind != kFirstMatch,submatch,nsubmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      if (nmatch < 1) {
        match = &local_290;
      }
      if (pSVar3->ptr_ + match->length_ != text->ptr_ + text->length_) goto LAB_00121fc0;
    }
    bVar1 = true;
  }
  else {
LAB_00121fc0:
    bVar1 = false;
  }
  if (local_280.visited_ != (uint32 *)0x0) {
    operator_delete__(local_280.visited_);
  }
  return bVar1;
}

Assistant:

bool Prog::UnsafeSearchBacktrack(const StringPiece& text,
                                 const StringPiece& context,
                                 Anchor anchor,
                                 MatchKind kind,
                                 StringPiece* match,
                                 int nmatch) {
  // If full match, we ask for an anchored longest match
  // and then check that match[0] == text.
  // So make sure match[0] exists.
  StringPiece sp0;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch < 1) {
      match = &sp0;
      nmatch = 1;
    }
  }

  // Run the search.
  Backtracker b(this);
  bool anchored = anchor == kAnchored;
  bool longest = kind != kFirstMatch;
  if (!b.Search(text, context, anchored, longest, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}